

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O1

string * __thiscall
CLI::Option::help_aftername_abi_cxx11_(string *__return_storage_ptr__,Option *this)

{
  Option *pOVar1;
  Option *this_00;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *psVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  stringstream out;
  string local_1e8;
  Option *local_1c8;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if (this->expected_ != 0) {
    if ((this->typeval_)._M_string_length != 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(this->typeval_)._M_dataplus._M_p,(this->typeval_)._M_string_length);
    }
    if ((this->defaultval_)._M_string_length != 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"=",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(this->defaultval_)._M_dataplus._M_p,(this->defaultval_)._M_string_length
                );
    }
    if (1 < this->expected_) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," x ",3);
      ::std::ostream::operator<<((ostream *)local_1a8,this->expected_);
    }
    if (this->expected_ == -1) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ...",4);
    }
  }
  if ((this->envname_)._M_string_length != 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," (env:",6);
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(this->envname_)._M_dataplus._M_p,
                        (this->envname_)._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  }
  local_1c8 = this;
  if ((this->requires_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," Requires:",10);
    psVar2 = &local_1c8->requires_;
    for (p_Var4 = (local_1c8->requires_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(psVar2->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var4)) {
      pOVar1 = *(Option **)(p_Var4 + 1);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
      get_name_abi_cxx11_(&local_1e8,pOVar1,false);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
    }
  }
  pOVar1 = local_1c8;
  if ((local_1c8->excludes_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," Excludes:",10);
    for (p_Var4 = (pOVar1->excludes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(pOVar1->excludes_)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var4)) {
      this_00 = *(Option **)(p_Var4 + 1);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
      get_name_abi_cxx11_(&local_1e8,this_00,false);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
    }
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return local_1c0;
}

Assistant:

std::string help_aftername() const {
        std::stringstream out;

        if(get_expected() != 0) {
            if(!typeval_.empty())
                out << " " << typeval_;
            if(!defaultval_.empty())
                out << "=" << defaultval_;
            if(get_expected() > 1)
                out << " x " << get_expected();
            if(get_expected() == -1)
                out << " ...";
        }
        if(!envname_.empty())
            out << " (env:" << envname_ << ")";
        if(!requires_.empty()) {
            out << " Requires:";
            for(const Option *opt : requires_)
                out << " " << opt->get_name();
        }
        if(!excludes_.empty()) {
            out << " Excludes:";
            for(const Option *opt : excludes_)
                out << " " << opt->get_name();
        }
        return out.str();
    }